

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O3

void __thiscall
ctemplate::CleanseAttribute::Modify
          (CleanseAttribute *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte bVar1;
  uint uVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  undefined8 uVar5;
  
  if (inlen != 0) {
    sVar4 = 0;
    do {
      bVar1 = in[sVar4];
      uVar2 = bVar1 - 0x2d;
      if (uVar2 < 0x33) {
        if ((0x4000000002003U >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
          pp_Var3 = out->_vptr_ExpandEmitter;
          goto LAB_0012b063;
        }
        if ((ulong)uVar2 != 0x10) goto LAB_0012b09d;
        if (sVar4 == 0 || inlen - 1 == sVar4) {
          uVar5 = 0x5f;
        }
        else {
          uVar5 = 0x3d;
        }
        (*out->_vptr_ExpandEmitter[2])(out,uVar5);
      }
      else {
LAB_0012b09d:
        pp_Var3 = out->_vptr_ExpandEmitter;
        if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
LAB_0012b063:
          (*pp_Var3[2])(out,(ulong)(uint)(int)(char)bVar1);
        }
        else {
          (*pp_Var3[5])(out,"_",1);
        }
      }
      sVar4 = sVar4 + 1;
    } while (inlen != sVar4);
  }
  return;
}

Assistant:

void CleanseAttribute::Modify(const char* in, size_t inlen,
                              const PerExpandData*,
                              ExpandEmitter* out, const string& arg) const {
  for (size_t i = 0; i < inlen; ++i) {
    char c = in[i];
    switch (c) {
      case '=': {
        if (i == 0 || i == (inlen - 1))
          out->Emit('_');
        else
          out->Emit(c);
        break;
      }
      case '-':
      case '.':
      case '_':
      case ':': {
        out->Emit(c);
        break;
      }
      default: {
        if ((c >= 'a' && c <= 'z') ||
            (c >= 'A' && c <= 'Z') ||
            (c >= '0' && c <= '9')) {
          out->Emit(c);
        } else {
          APPEND("_");
        }
        break;
      }
    }
  }
}